

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# casts.h
# Opt level: O1

void __thiscall
CoreML::Specification::CustomModel_CustomModelParamValue::CheckTypeAndMergeFrom
          (CustomModel_CustomModelParamValue *this,MessageLite *from)

{
  int iVar1;
  int32_t iVar2;
  undefined4 uVar3;
  ulong uVar4;
  LogMessage *other;
  undefined8 *puVar5;
  undefined8 *puVar6;
  ValueUnion VVar7;
  _func_int **pp_Var8;
  LogFinisher LStack_61;
  _func_int **pp_Stack_60;
  LogMessage LStack_58;
  
  if (from->_vptr_MessageLite != (_func_int **)&PTR__CustomModel_CustomModelParamValue_004bd9e8) {
    __assert_fail("f == nullptr || dynamic_cast<To>(f) != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/stubs/casts.h"
                  ,0x5e,
                  "To google::protobuf::internal::down_cast(From *) [To = const CoreML::Specification::CustomModel_CustomModelParamValue *, From = const google::protobuf::MessageLite]"
                 );
  }
  if ((CustomModel_CustomModelParamValue *)from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&LStack_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O1/mlmodel/format/CustomModel.pb.cc"
               ,0x181);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&LStack_58,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&LStack_61,other);
    google::protobuf::internal::LogMessage::~LogMessage(&LStack_58);
  }
  iVar1 = *(int *)((long)&from[1]._internal_metadata_.ptr_ + 4);
  if (iVar1 < 0x28) {
    if (iVar1 == 10) {
      if (iVar1 == 10) {
        pp_Var8 = from[1]._vptr_MessageLite;
      }
      else {
        pp_Var8 = (_func_int **)0x0;
      }
      if (this->_oneof_case_[0] != 10) {
        pp_Stack_60 = pp_Var8;
        clear_value(this);
        this->_oneof_case_[0] = 10;
        pp_Var8 = pp_Stack_60;
      }
      (this->value_).doublevalue_ = (double)pp_Var8;
      goto LAB_0033c6c6;
    }
    if (iVar1 != 0x14) {
      if (iVar1 == 0x1e) {
        iVar2 = *(int32_t *)&from[1]._vptr_MessageLite;
        if (this->_oneof_case_[0] != 0x1e) {
          clear_value(this);
          this->_oneof_case_[0] = 0x1e;
        }
        (this->value_).intvalue_ = iVar2;
      }
      goto LAB_0033c6c6;
    }
    if (iVar1 == 0x14) {
      puVar6 = (undefined8 *)((ulong)from[1]._vptr_MessageLite & 0xfffffffffffffffe);
    }
    else {
      puVar6 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
    }
    if (this->_oneof_case_[0] != 0x14) {
      clear_value(this);
      this->_oneof_case_[0] = 0x14;
LAB_0033c6a0:
      (this->value_).doublevalue_ =
           (double)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
    }
  }
  else {
    if (iVar1 == 0x28) {
      if (iVar1 == 0x28) {
        VVar7 = *(ValueUnion *)(from + 1);
      }
      else {
        VVar7.doublevalue_ = 0.0;
      }
      if (this->_oneof_case_[0] != 0x28) {
        clear_value(this);
        this->_oneof_case_[0] = 0x28;
      }
      this->value_ = VVar7;
      goto LAB_0033c6c6;
    }
    if (iVar1 == 0x32) {
      uVar3 = *(undefined4 *)&from[1]._vptr_MessageLite;
      if (this->_oneof_case_[0] != 0x32) {
        clear_value(this);
        this->_oneof_case_[0] = 0x32;
      }
      (this->value_).boolvalue_ = SUB41(uVar3,0);
      goto LAB_0033c6c6;
    }
    if (iVar1 != 0x3c) goto LAB_0033c6c6;
    if (iVar1 == 0x3c) {
      puVar6 = (undefined8 *)((ulong)from[1]._vptr_MessageLite & 0xfffffffffffffffe);
    }
    else {
      puVar6 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
    }
    if (this->_oneof_case_[0] != 0x3c) {
      clear_value(this);
      this->_oneof_case_[0] = 0x3c;
      goto LAB_0033c6a0;
    }
  }
  uVar4 = (this->super_MessageLite)._internal_metadata_.ptr_;
  puVar5 = (undefined8 *)(uVar4 & 0xfffffffffffffffc);
  if ((uVar4 & 1) != 0) {
    puVar5 = (undefined8 *)*puVar5;
  }
  google::protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)&this->value_,puVar6,puVar5);
LAB_0033c6c6:
  uVar4 = (from->_internal_metadata_).ptr_;
  if ((uVar4 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar4 & 0xfffffffffffffffc) + 8));
  }
  return;
}

Assistant:

inline To down_cast(From* f) {                   // so we only accept pointers
  // Ensures that To is a sub-type of From *.  This test is here only
  // for compile-time type checking, and has no overhead in an
  // optimized build at run-time, as it will be optimized away
  // completely.
  if (false) {
    implicit_cast<From*, To>(0);
  }

#if !defined(NDEBUG) && PROTOBUF_RTTI
  assert(f == nullptr || dynamic_cast<To>(f) != nullptr);  // RTTI: debug mode only!
#endif
  return static_cast<To>(f);
}